

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall CPubKey::IsFullyValid(CPubKey *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  secp256k1_pubkey pubkey;
  CPubKey *in_stack_ffffffffffffff88;
  undefined1 local_49;
  size_t in_stack_ffffffffffffffe0;
  uchar *in_stack_ffffffffffffffe8;
  secp256k1_pubkey *in_stack_fffffffffffffff0;
  secp256k1_context *ctx;
  
  ctx = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  bVar1 = IsValid(in_stack_ffffffffffffff88);
  if (bVar1) {
    size(in_stack_ffffffffffffff88);
    iVar2 = secp256k1_ec_pubkey_parse
                      (ctx,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                       in_stack_ffffffffffffffe0);
    local_49 = iVar2 != 0;
  }
  else {
    local_49 = false;
  }
  if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) == ctx) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::IsFullyValid() const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    return secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size());
}